

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O0

int light_add_option(light_pcapng section,light_pcapng pcapng,light_option option,light_boolean copy
                    )

{
  light_boolean lVar1;
  _light_option *p_Var2;
  int in_ECX;
  _light_option *in_RDX;
  long in_RSI;
  _light_pcapng *in_RDI;
  bool bVar3;
  _light_section_header *shb;
  light_option opt_endofopt;
  light_option current;
  light_option iterator;
  light_option option_list;
  size_t option_size;
  _light_option *in_stack_ffffffffffffffa8;
  long local_48;
  _light_option *local_40;
  _light_option *local_38;
  size_t local_30;
  int local_4;
  
  if (in_RDX == (_light_option *)0x0) {
    local_4 = -3;
  }
  else {
    local_38 = in_RDX;
    if (in_ECX == 1) {
      local_38 = __copy_option(in_stack_ffffffffffffffa8);
    }
    local_30 = __get_option_total_size(local_38);
    if (*(long *)(in_RSI + 0x10) == 0) {
      for (local_40 = local_38; local_40->next_option != (_light_option *)0x0;
          local_40 = local_40->next_option) {
      }
      if (local_40->custom_option_code != 0) {
        p_Var2 = (_light_option *)calloc(1,0x18);
        local_40->next_option = p_Var2;
        local_30 = local_30 + 4;
      }
      *(_light_option **)(in_RSI + 0x10) = local_38;
    }
    else {
      local_48 = *(long *)(in_RSI + 0x10);
      while( true ) {
        bVar3 = false;
        if (*(long *)(local_48 + 0x10) != 0) {
          bVar3 = **(short **)(local_48 + 0x10) != 0;
        }
        if (!bVar3) break;
        local_48 = *(long *)(local_48 + 0x10);
      }
      p_Var2 = *(_light_option **)(local_48 + 0x10);
      *(_light_option **)(local_48 + 0x10) = local_38;
      local_38->next_option = p_Var2;
    }
    *(int *)(in_RSI + 4) = *(int *)(in_RSI + 4) + (int)local_30;
    lVar1 = __is_section_header(in_RDI);
    if (lVar1 == LIGHT_TRUE) {
      *(size_t *)(in_RDI->block_body + 2) = local_30 + *(long *)(in_RDI->block_body + 2);
    }
    else if (in_RDI != (_light_pcapng *)0x0) {
      fprintf(_stderr,"Warning at: %s::%s::%d, %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_manipulate.c"
              ,"light_add_option",0x7c,"\"PCAPNG block is not section header!\"");
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int light_add_option(light_pcapng section, light_pcapng pcapng, light_option option, light_boolean copy)
{
	size_t option_size = 0;
	light_option option_list = NULL;

	if (option == NULL) {
		return LIGHT_INVALID_ARGUMENT;
	}

	if (copy == LIGHT_TRUE) {
		option_list = __copy_option(option);
	}
	else {
		option_list = option;
	}

	option_size = __get_option_total_size(option_list);

	if (pcapng->options == NULL) {
		light_option iterator = option_list;
		while (iterator->next_option != NULL) {
			iterator = iterator->next_option;
		}

		if (iterator->custom_option_code != 0) {
			// Add terminator option.
			iterator->next_option = calloc(1, sizeof(struct _light_option));
			option_size += 4;
		}
		pcapng->options = option_list;
	}
	else {
		light_option current = pcapng->options;
		while (current->next_option && current->next_option->custom_option_code != 0) {
			current = current->next_option;
		}

		light_option opt_endofopt = current->next_option;
		current->next_option = option_list;
		option_list->next_option = opt_endofopt;
	}

	pcapng->block_total_lenght += option_size;

	if (__is_section_header(section) == 1) {
		struct _light_section_header *shb = (struct _light_section_header *)section->block_body;
		shb->section_length += option_size;
	}
	else if (section != NULL) {
		PCAPNG_WARNING("PCAPNG block is not section header!");
	}

	return LIGHT_SUCCESS;
}